

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void MeCab::itoa<int>(int val,char *s)

{
  char *pcVar1;
  char *__last;
  char *in_RSI;
  int in_EDI;
  int mod;
  char *t;
  int local_4;
  
  pcVar1 = in_RSI;
  local_4 = in_EDI;
  if (in_EDI < 0) {
    pcVar1 = in_RSI + 1;
    *in_RSI = '-';
    local_4 = -in_EDI;
    in_RSI = pcVar1;
  }
  for (; local_4 != 0; local_4 = local_4 / 10) {
    *pcVar1 = (char)(local_4 % 10) + '0';
    pcVar1 = pcVar1 + 1;
  }
  __last = pcVar1;
  if (in_RSI == pcVar1) {
    __last = pcVar1 + 1;
    *pcVar1 = '0';
  }
  *__last = '\0';
  std::reverse<char*>(in_RSI,__last);
  return;
}

Assistant:

inline void itoa(T val, char *s) {
  char *t;
  T mod;

  if (val < 0) {
    *s++ = '-';
    val = -val;
  }
  t = s;

  while (val) {
    mod = val % 10;
    *t++ = static_cast<char>(mod) + '0';
    val /= 10;
  }

  if (s == t) *t++ = '0';
  *t = '\0';
  std::reverse(s, t);

  return;
}